

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool cs_impl::file_system::chmod_r(string *path_input,string *mode)

{
  char cVar1;
  pointer pcVar2;
  uint __mode;
  int iVar3;
  pointer pbVar4;
  bool bVar5;
  __string_type __str;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  allocator_type local_9b;
  key_equal local_9a;
  hasher local_99;
  undefined8 local_98;
  ulong local_90;
  long local_88 [2];
  raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_98 = (long *)CONCAT62(local_98._2_6_,0x5c2f);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<char>>
  ::raw_hash_set<char_const*>
            ((raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<char>>
              *)&local_78,(char *)&local_98,(char *)((long)&local_98 + 2),0,&local_99,&local_9a,
             &local_9b);
  cs_system_impl::split(&local_48,path_input,(set_t<char> *)&local_78);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
  ::destroy_slots(&local_78);
  local_78.ctrl_ = (ctrl_t *)&local_78.size_;
  local_78.slots_ = (slot_type *)0x0;
  local_78.size_._0_1_ = 0;
  if ((path_input->_M_string_length != 0) &&
     ((cVar1 = *(path_input->_M_dataplus)._M_p, cVar1 == '\\' || (cVar1 == '/')))) {
    std::__cxx11::string::_M_replace_aux((ulong)&local_78,0,0,'\x01');
  }
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = true;
  }
  else {
    pbVar4 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar2 = (pbVar4->_M_dataplus)._M_p;
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar2,pcVar2 + pbVar4->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_98,local_90,0,'\x01');
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      __mode = cs_system_impl::parse_mode(mode);
      iVar3 = ::chmod(local_78.ctrl_,__mode);
      bVar5 = iVar3 == 0;
    } while ((bVar5) &&
            (pbVar4 = pbVar4 + 1,
            pbVar4 != local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish));
  }
  if ((size_t *)local_78.ctrl_ != &local_78.size_) {
    operator_delete(local_78.ctrl_,CONCAT71(local_78.size_._1_7_,(undefined1)local_78.size_) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar5;
}

Assistant:

bool chmod_r(const std::string &path_input, const std::string &mode)
		{
			auto dirs = cs_system_impl::split(path_input, {'/', '\\'});
			std::string path;
			if (path_input.size() > 0 && (path_input[0] == '/' || path_input[0] == '\\'))
				path = cs::path_separator;
			for (auto &dir: dirs) {
				path += dir + cs::path_separator;
				// DO NOT SKIP when dir is a directory
				// directory has permissions too
				if (!cs_system_impl::chmod_impl(path, cs_system_impl::parse_mode(mode)))
					return false;
			}
			return true;
		}